

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DataTypeExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::DataTypeExpression,slang::ast::Type_const&,slang::SourceRange>
          (BumpAllocator *this,Type *args,SourceRange *args_1)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  DataTypeExpression *pDVar3;
  
  pDVar3 = (DataTypeExpression *)allocate(this,0x30,8);
  SVar1 = args_1->startLoc;
  SVar2 = args_1->endLoc;
  (pDVar3->super_Expression).kind = DataType;
  (pDVar3->super_Expression).type.ptr = args;
  (pDVar3->super_Expression).constant = (ConstantValue *)0x0;
  (pDVar3->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pDVar3->super_Expression).sourceRange.startLoc = SVar1;
  (pDVar3->super_Expression).sourceRange.endLoc = SVar2;
  return pDVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }